

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_exceptions.hpp
# Opt level: O0

void __thiscall CompoundFile::Exception::Exception(Exception *this,wstring *what)

{
  wstring *in_RSI;
  runtime_error *in_RDI;
  
  std::runtime_error::runtime_error(in_RDI,"Use whatAsWString() method.");
  *(undefined ***)in_RDI = &PTR__Exception_001ce840;
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x10),in_RSI);
  return;
}

Assistant:

inline
Exception::Exception( const std::wstring & what )
	:	std::runtime_error( "Use whatAsWString() method." )
	,	m_what( what )
{
}